

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O3

common_chat_msg *
common_chat_parse(common_chat_msg *__return_storage_ptr__,string *input,common_chat_format format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar5;
  reference this;
  const_reference pvVar6;
  reference pvVar7;
  runtime_error *this_00;
  long lVar8;
  ulong uVar9;
  char *pcVar10;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var11;
  undefined8 uVar12;
  long lVar13;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __s;
  pointer pcVar14;
  initializer_list_t init;
  initializer_list_t init_00;
  smatch match_1;
  smatch match;
  json data;
  string content;
  string_type code;
  undefined1 local_138 [16];
  undefined1 local_128 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  _Alloc_hider local_f8;
  size_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  undefined1 local_d8 [40];
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  local_b0;
  _Any_data local_98;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  undefined8 local_70;
  data local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  switch(format) {
  case COMMON_CHAT_FORMAT_CONTENT_ONLY:
    (__return_storage_ptr__->role)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->role).field_2;
    (__return_storage_ptr__->role)._M_string_length = 0;
    (__return_storage_ptr__->role).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->content)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->content).field_2;
    (__return_storage_ptr__->content)._M_string_length = 0;
    (__return_storage_ptr__->content).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->content_parts).
    super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->content_parts).
    super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->content_parts).
    super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->tool_calls).
    super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->tool_calls).
    super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->tool_calls).
    super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->reasoning_content)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->reasoning_content).field_2;
    (__return_storage_ptr__->reasoning_content)._M_string_length = 0;
    (__return_storage_ptr__->reasoning_content).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->tool_name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->tool_name).field_2;
    (__return_storage_ptr__->tool_name)._M_string_length = 0;
    (__return_storage_ptr__->tool_name).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->tool_call_id)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->tool_call_id).field_2;
    (__return_storage_ptr__->tool_call_id)._M_string_length = 0;
    (__return_storage_ptr__->tool_call_id).field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x21ff93);
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->content);
    return __return_storage_ptr__;
  case COMMON_CHAT_FORMAT_GENERIC:
    local_98._M_unused._M_object = (void *)0x0;
    local_98._8_8_ = 0;
    local_88.
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .first._M_current = (char *)0x0;
    local_88.
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .second._M_current = (char *)0x0;
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
    ::parse<std::__cxx11::string_const&>
              ((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)&local_b0,input,(parser_callback_t *)&local_98,true,false);
    if ((code *)local_88.
                super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .first._M_current != (code *)0x0) {
      (*(code *)local_88.
                super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .first._M_current)(&local_98,&local_98,3);
    }
    (__return_storage_ptr__->role)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->role).field_2;
    (__return_storage_ptr__->role)._M_string_length = 0;
    (__return_storage_ptr__->role).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->content)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->content).field_2;
    (__return_storage_ptr__->content)._M_string_length = 0;
    (__return_storage_ptr__->content).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->content_parts).
    super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->content_parts).
    super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->content_parts).
    super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->tool_calls).
    super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->tool_calls).
    super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->tool_calls).
    super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->reasoning_content)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->reasoning_content).field_2;
    (__return_storage_ptr__->reasoning_content)._M_string_length = 0;
    (__return_storage_ptr__->reasoning_content).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->tool_name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->tool_name).field_2;
    (__return_storage_ptr__->tool_name)._M_string_length = 0;
    (__return_storage_ptr__->tool_name).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->tool_call_id)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->tool_call_id).field_2;
    (__return_storage_ptr__->tool_call_id)._M_string_length = 0;
    (__return_storage_ptr__->tool_call_id).field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x21ff93);
    bVar3 = nlohmann::json_abi_v3_11_3::
            basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::contains<const_char_(&)[11],_0>(&local_b0.owned_value,(char (*) [11])"tool_calls");
    if (bVar3) {
      psVar5 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)nlohmann::json_abi_v3_11_3::
                  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::at<const_char_(&)[11],_0>(&local_b0.owned_value,(char (*) [11])"tool_calls");
      local_d8._8_8_ =
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
            *)0x0;
      local_d8._16_8_ = (pointer)0x0;
      local_d8._24_8_ = (char *)0x8000000000000000;
      local_d8._0_8_ = psVar5;
      nlohmann::json_abi_v3_11_3::detail::
      iter_impl<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
      ::set_begin((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   *)local_d8);
      local_50._M_string_length = 0;
      local_50.field_2._M_allocated_capacity = 0;
      local_50.field_2._8_8_ = 0x8000000000000000;
      local_50._M_dataplus._M_p = (pointer)psVar5;
      nlohmann::json_abi_v3_11_3::detail::
      iter_impl<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
      ::set_end((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                 *)&local_50);
      while (bVar3 = nlohmann::json_abi_v3_11_3::detail::
                     iter_impl<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                     ::
                     operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                               ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                 *)local_d8,
                                (iter_impl<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                 *)&local_50), !bVar3) {
        this = nlohmann::json_abi_v3_11_3::detail::
               iter_impl<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
               ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                            *)local_d8);
        pvVar6 = nlohmann::json_abi_v3_11_3::
                 basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 ::at<const_char_(&)[5],_0>(this,(char (*) [5])0x2230bb);
        nlohmann::json_abi_v3_11_3::
        basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((common_chat_tool_call *)local_138,pvVar6);
        pvVar6 = nlohmann::json_abi_v3_11_3::
                 basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 ::at<const_char_(&)[10],_0>(this,(char (*) [10])0x220cf5);
        nlohmann::json_abi_v3_11_3::
        basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::dump((string_t *)(local_128 + 0x10),pvVar6,-1,' ',false,strict);
        bVar3 = nlohmann::json_abi_v3_11_3::
                basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::contains<const_char_(&)[3],_0>(this,(char (*) [3])0x21fe19);
        if (bVar3) {
          pvVar6 = nlohmann::json_abi_v3_11_3::
                   basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   ::at<const_char_(&)[3],_0>(this,(char (*) [3])0x21fe19);
          nlohmann::json_abi_v3_11_3::
          basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::basic_json((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_60,pvVar6);
        }
        else {
          nlohmann::json_abi_v3_11_3::
          basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::basic_json<const_char_(&)[1],_char[1],_0>
                    ((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_60,(char (*) [1])0x2208aa);
        }
        nlohmann::json_abi_v3_11_3::
        basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_f8,
                   (basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_60);
        std::vector<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>::
        emplace_back<common_chat_tool_call>
                  (&__return_storage_ptr__->tool_calls,(common_chat_tool_call *)local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_p != &local_e8) {
          operator_delete(local_f8._M_p,
                          CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0]) +
                          1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_128._17_7_,local_128[0x10]) != &local_108) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_128._17_7_,local_128[0x10]),
                          local_108._M_allocated_capacity + 1);
        }
        if ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_138._0_8_ !=
            (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_138 + 0x10)) {
          operator_delete((void *)local_138._0_8_,
                          CONCAT17(local_128[7],
                                   CONCAT16(local_128[6],
                                            CONCAT15(local_128[5],
                                                     CONCAT14(local_128[4],local_128._0_4_)))) + 1);
        }
        nlohmann::json_abi_v3_11_3::
        basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)&local_60,false);
        nlohmann::json_abi_v3_11_3::
        basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_60);
        nlohmann::json_abi_v3_11_3::detail::
        iter_impl<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
        ::operator++((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                      *)local_d8);
      }
    }
    else {
      bVar3 = nlohmann::json_abi_v3_11_3::
              basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::contains<const_char_(&)[10],_0>(&local_b0.owned_value,(char (*) [10])0x22115a);
      if (bVar3) {
        pvVar7 = nlohmann::json_abi_v3_11_3::
                 basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 ::at<const_char_(&)[10],_0>(&local_b0.owned_value,(char (*) [10])0x22115a);
        pvVar7 = nlohmann::json_abi_v3_11_3::
                 basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 ::at<const_char_(&)[5],_0>(pvVar7,(char (*) [5])0x2230bb);
        nlohmann::json_abi_v3_11_3::
        basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (local_138,pvVar7);
        pvVar7 = nlohmann::json_abi_v3_11_3::
                 basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 ::at<const_char_(&)[10],_0>(&local_b0.owned_value,(char (*) [10])0x22115a);
        pvVar7 = nlohmann::json_abi_v3_11_3::
                 basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 ::at<const_char_(&)[10],_0>(pvVar7,(char (*) [10])0x220cf5);
        nlohmann::json_abi_v3_11_3::
        basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::dump((string_t *)(local_128 + 0x10),pvVar7,-1,' ',false,strict);
        local_f0 = 0;
        local_e8._M_local_buf[0] = '\0';
        local_f8._M_p = (pointer)&local_e8;
        std::vector<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>::
        emplace_back<common_chat_tool_call>
                  (&__return_storage_ptr__->tool_calls,(common_chat_tool_call *)local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_p != &local_e8) {
          operator_delete(local_f8._M_p,
                          CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0]) +
                          1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_128._17_7_,local_128[0x10]) != &local_108) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_128._17_7_,local_128[0x10]),
                          local_108._M_allocated_capacity + 1);
        }
      }
      else {
        bVar3 = nlohmann::json_abi_v3_11_3::
                basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::contains<const_char_(&)[9],_0>(&local_b0.owned_value,(char (*) [9])0x2208ff);
        if (!bVar3) goto LAB_001991f1;
        pvVar7 = nlohmann::json_abi_v3_11_3::
                 basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 ::at<const_char_(&)[9],_0>(&local_b0.owned_value,(char (*) [9])0x2208ff);
        if ((pvVar7->m_data).m_type == string) {
          nlohmann::json_abi_v3_11_3::
          basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (local_138,pvVar7);
        }
        else {
          nlohmann::json_abi_v3_11_3::
          basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::dump((string_t *)local_138,pvVar7,2,' ',false,strict);
        }
        std::__cxx11::string::operator=
                  ((string *)&__return_storage_ptr__->content,(string *)local_138);
      }
      if ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_138._0_8_ !=
          (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)(local_138 + 0x10)) {
        operator_delete((void *)local_138._0_8_,
                        CONCAT17(local_128[7],
                                 CONCAT16(local_128[6],
                                          CONCAT15(local_128[5],
                                                   CONCAT14(local_128[4],local_128._0_4_)))) + 1);
      }
    }
LAB_001991f1:
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::assert_invariant(&local_b0.owned_value,false);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data((data *)&local_b0);
    return __return_storage_ptr__;
  case COMMON_CHAT_FORMAT_MISTRAL_NEMO:
    local_138._0_8_ = local_138 + 0x10;
    local_128._0_4_ = 0x4f4f545b;
    local_128[4] = 'L';
    local_128[5] = '_';
    local_128[6] = 'C';
    local_128._7_4_ = 0x534c4c41;
    local_128[0xb] = ']';
    local_138._8_8_ = 0xc;
    local_128._12_4_ = local_128._12_4_ & 0xffffff00;
    parse_prefixed_json_tool_call_array(__return_storage_ptr__,input,(string *)local_138,0);
    break;
  case COMMON_CHAT_FORMAT_LLAMA_3_X:
    bVar3 = false;
    goto LAB_00198624;
  case COMMON_CHAT_FORMAT_LLAMA_3_X_WITH_BUILTIN_TOOLS:
    bVar3 = true;
LAB_00198624:
    common_chat_parse_llama_3_1(__return_storage_ptr__,input,bVar3);
    return __return_storage_ptr__;
  case COMMON_CHAT_FORMAT_DEEPSEEK_R1:
    bVar3 = false;
    goto LAB_0019894e;
  case COMMON_CHAT_FORMAT_DEEPSEEK_R1_EXTRACT_REASONING:
    bVar3 = true;
LAB_0019894e:
    common_chat_parse_deepseek_r1(__return_storage_ptr__,input,bVar3);
    return __return_storage_ptr__;
  case COMMON_CHAT_FORMAT_FIREFUNCTION_V2:
    local_138._0_8_ = local_138 + 0x10;
    local_128._0_4_ = 0x6e756620;
    local_128[4] = 'c';
    local_128[5] = 't';
    local_128[6] = 'o';
    local_128._7_4_ = 0x5b736c6f;
    local_138._8_8_ = 0xb;
    local_128[0xb] = '\0';
    parse_prefixed_json_tool_call_array(__return_storage_ptr__,input,(string *)local_138,1);
    break;
  case COMMON_CHAT_FORMAT_FUNCTIONARY_V3_2:
    if ((common_chat_parse_functionary_v3_2(std::__cxx11::string_const&)::function_regex_abi_cxx11_
         == '\0') &&
       (iVar4 = __cxa_guard_acquire(&common_chat_parse_functionary_v3_2(std::__cxx11::string_const&)
                                     ::function_regex_abi_cxx11_), iVar4 != 0)) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                 common_chat_parse_functionary_v3_2(std::__cxx11::string_const&)::
                 function_regex_abi_cxx11_,"(?:>>>)?(?:assistant<|end_header_id|>\\n)?(\\w+)\\n",
                 0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   common_chat_parse_functionary_v3_2(std::__cxx11::string_const&)::
                   function_regex_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&common_chat_parse_functionary_v3_2(std::__cxx11::string_const&)::
                           function_regex_abi_cxx11_);
    }
    if ((common_chat_parse_functionary_v3_2(std::__cxx11::string_const&)::close_regex_abi_cxx11_ ==
         '\0') &&
       (iVar4 = __cxa_guard_acquire(&common_chat_parse_functionary_v3_2(std::__cxx11::string_const&)
                                     ::close_regex_abi_cxx11_), iVar4 != 0)) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                 common_chat_parse_functionary_v3_2(std::__cxx11::string_const&)::
                 close_regex_abi_cxx11_,"$|(?=>>>)",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   common_chat_parse_functionary_v3_2(std::__cxx11::string_const&)::
                   close_regex_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&common_chat_parse_functionary_v3_2(std::__cxx11::string_const&)::
                           close_regex_abi_cxx11_);
    }
    local_98._M_unused._M_object = &local_88;
    local_98._8_8_ = 0;
    local_88.
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .first._M_current =
         local_88.
         super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .first._M_current & 0xffffffffffffff00;
    pcVar14 = (input->_M_dataplus)._M_p;
    sVar2 = input->_M_string_length;
    _Var11._M_current = pcVar14 + sVar2;
    psVar5 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_138 + 0x10);
    local_128._0_4_ = 0xa6c6c61;
    local_138._8_8_ = 4;
    local_128[4] = '\0';
    local_138._0_8_ = psVar5;
    if (sVar2 == 0) {
LAB_001990c5:
      local_d8._0_8_ =
           (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_d8 + 0x10);
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)local_d8,pcVar14,_Var11._M_current);
      local_128[0x10] = false;
      parse_json_tool_calls
                (__return_storage_ptr__,(string *)local_d8,
                 (optional<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_> *)
                 local_138,
                 (regex *)common_chat_parse_functionary_v3_2(std::__cxx11::string_const&)::
                          function_regex_abi_cxx11_,
                 (regex *)common_chat_parse_functionary_v3_2(std::__cxx11::string_const&)::
                          close_regex_abi_cxx11_,true);
      if (local_128[0x10] == true) {
        local_128[0x10] = false;
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_138);
      }
      if ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_d8._0_8_ !=
          (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)(local_d8 + 0x10)) {
        operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98,
                     &__return_storage_ptr__->content);
      std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->content,(string *)local_138);
      if ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_138._0_8_ != psVar5) {
        operator_delete((void *)local_138._0_8_,
                        CONCAT17(local_128[7],
                                 CONCAT16(local_128[6],
                                          CONCAT15(local_128[5],
                                                   CONCAT14(local_128[4],local_128._0_4_)))) + 1);
      }
    }
    else {
      uVar9 = 3;
      if (sVar2 - 1 < 3) {
        uVar9 = sVar2 - 1;
      }
      lVar8 = uVar9 + 0x11;
      lVar13 = 0;
      do {
        if (pcVar14[lVar13] != local_138[lVar13 + 0x10]) {
          lVar8 = lVar13 + 0x10;
          break;
        }
        lVar13 = lVar13 + 1;
      } while (uVar9 + 1 != lVar13);
      __s._M_current = pcVar14 + lVar13;
      if (lVar8 != 0x14) goto LAB_001990c5;
      local_128._0_4_ = 0;
      local_128[4] = '\0';
      local_128[5] = '\0';
      local_128[6] = '\0';
      local_128._7_4_ = 0;
      local_128[0xb] = '\0';
      local_128._12_4_ = 0;
      local_138._0_8_ =
           (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x0;
      local_138._8_8_ = 0;
      bVar3 = std::__detail::
              __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                        (__s,_Var11,
                         (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)local_138,
                         (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                         common_chat_parse_functionary_v3_2(std::__cxx11::string_const&)::
                         function_regex_abi_cxx11_,0);
      if (bVar3) {
        lVar8 = local_138._8_8_ - 0x48;
        if (3 < (ulong)(((long)(local_138._8_8_ - local_138._0_8_) >> 3) * -0x5555555555555555)) {
          lVar8 = local_138._8_8_ - 0x30;
        }
        pcVar14 = *(pointer *)(lVar8 + 8);
        local_d8._0_8_ = local_d8 + 0x10;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)local_d8,__s._M_current,pcVar14);
        std::__cxx11::string::operator=((string *)local_98._M_pod_data,(string *)local_d8);
        __s._M_current = pcVar14;
        if ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d8._0_8_ !=
            (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_d8 + 0x10)) {
          operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
        }
      }
      else {
        (__return_storage_ptr__->role)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->role).field_2;
        (__return_storage_ptr__->role)._M_string_length = 0;
        (__return_storage_ptr__->role).field_2._M_local_buf[0] = '\0';
        (__return_storage_ptr__->content)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->content).field_2;
        (__return_storage_ptr__->content)._M_string_length = 0;
        (__return_storage_ptr__->content).field_2._M_local_buf[0] = '\0';
        (__return_storage_ptr__->content_parts).
        super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->content_parts).
        super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->content_parts).
        super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (__return_storage_ptr__->tool_calls).
        super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->tool_calls).
        super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->tool_calls).
        super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (__return_storage_ptr__->reasoning_content)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->reasoning_content).field_2;
        (__return_storage_ptr__->reasoning_content)._M_string_length = 0;
        (__return_storage_ptr__->reasoning_content).field_2._M_local_buf[0] = '\0';
        (__return_storage_ptr__->tool_name)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->tool_name).field_2;
        (__return_storage_ptr__->tool_name)._M_string_length = 0;
        (__return_storage_ptr__->tool_name).field_2._M_local_buf[0] = '\0';
        (__return_storage_ptr__->tool_call_id)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->tool_call_id).field_2;
        (__return_storage_ptr__->tool_call_id)._M_string_length = 0;
        (__return_storage_ptr__->tool_call_id).field_2._M_local_buf[0] = '\0';
        std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x21ff93);
        local_d8._0_8_ =
             (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_d8 + 0x10);
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)local_d8,__s._M_current,_Var11._M_current);
        std::__cxx11::string::operator=
                  ((string *)&__return_storage_ptr__->content,(string *)local_d8);
        if ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d8._0_8_ !=
            (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_d8 + 0x10)) {
          operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
        }
      }
      if ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_138._0_8_ !=
          (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        operator_delete((void *)local_138._0_8_,
                        CONCAT17(local_128[7],
                                 CONCAT16(local_128[6],
                                          CONCAT15(local_128[5],
                                                   CONCAT14(local_128[4],local_128._0_4_)))) -
                        local_138._0_8_);
      }
      pcVar14 = __s._M_current;
      if (bVar3) goto LAB_001990c5;
    }
    _Var11._M_current =
         local_88.
         super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .first._M_current;
    uVar12 = local_98._M_unused._0_8_;
    if ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_98._M_unused._0_8_ == &local_88) {
      return __return_storage_ptr__;
    }
    goto LAB_0019919b;
  case COMMON_CHAT_FORMAT_FUNCTIONARY_V3_1_LLAMA_3_1:
    if ((common_chat_parse_functionary_v3_1_llama_3_1(std::__cxx11::string_const&)::
         python_tag_regex_abi_cxx11_ == '\0') &&
       (iVar4 = __cxa_guard_acquire(&common_chat_parse_functionary_v3_1_llama_3_1(std::__cxx11::string_const&)
                                     ::python_tag_regex_abi_cxx11_), iVar4 != 0)) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                 common_chat_parse_functionary_v3_1_llama_3_1(std::__cxx11::string_const&)::
                 python_tag_regex_abi_cxx11_,"<\\|python_tag\\|>([\\s\\S\\n]*)$",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   common_chat_parse_functionary_v3_1_llama_3_1(std::__cxx11::string_const&)::
                   python_tag_regex_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&common_chat_parse_functionary_v3_1_llama_3_1(std::__cxx11::string_const&)
                           ::python_tag_regex_abi_cxx11_);
    }
    local_d8._16_8_ = (pointer)0x0;
    local_d8._24_8_ = (char *)0x0;
    local_d8._0_8_ =
         (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
    local_d8._8_8_ =
         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
          *)0x0;
    _Var11._M_current = (input->_M_dataplus)._M_p;
    bVar3 = std::__detail::
            __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                      (_Var11,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               )(_Var11._M_current + input->_M_string_length),
                       (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)local_d8,
                       (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                       common_chat_parse_functionary_v3_1_llama_3_1(std::__cxx11::string_const&)::
                       python_tag_regex_abi_cxx11_,0);
    if (bVar3) {
      lVar8 = local_d8._8_8_ - local_d8._0_8_;
      if ((lVar8 == 0) || (0xfffffffffffffffd < (lVar8 >> 3) * -0x5555555555555555 - 5U)) {
        psVar5 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_d8._0_8_ + lVar8 + -0x48);
      }
      else {
        psVar5 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_d8._0_8_ + 0x18);
      }
      paVar1 = &local_50.field_2;
      local_50._M_dataplus._M_p = (pointer)paVar1;
      if (psVar5->matched == true) {
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_50,
                   ((json_value *)
                   &psVar5->
                    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )->object,
                   ((json_value *)
                   &psVar5->
                    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )[1].object);
      }
      else {
        local_50._M_string_length = 0;
        local_50.field_2._M_allocated_capacity =
             local_50.field_2._M_allocated_capacity & 0xffffffffffffff00;
      }
      (__return_storage_ptr__->role)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->role).field_2;
      (__return_storage_ptr__->role)._M_string_length = 0;
      (__return_storage_ptr__->role).field_2._M_local_buf[0] = '\0';
      (__return_storage_ptr__->content)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->content).field_2;
      (__return_storage_ptr__->content)._M_string_length = 0;
      (__return_storage_ptr__->content).field_2._M_local_buf[0] = '\0';
      (__return_storage_ptr__->content_parts).
      super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->content_parts).
      super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->content_parts).
      super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->tool_calls).
      super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->tool_calls).
      super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->tool_calls).
      super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->reasoning_content)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->reasoning_content).field_2;
      (__return_storage_ptr__->reasoning_content)._M_string_length = 0;
      (__return_storage_ptr__->reasoning_content).field_2._M_local_buf[0] = '\0';
      (__return_storage_ptr__->tool_name)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->tool_name).field_2;
      (__return_storage_ptr__->tool_name)._M_string_length = 0;
      (__return_storage_ptr__->tool_name).field_2._M_local_buf[0] = '\0';
      (__return_storage_ptr__->tool_call_id)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->tool_call_id).field_2;
      (__return_storage_ptr__->tool_call_id)._M_string_length = 0;
      (__return_storage_ptr__->tool_call_id).field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x21ff93);
      lVar8 = -0x30;
      if ((ulong)(((long)(local_d8._8_8_ - local_d8._0_8_) >> 3) * -0x5555555555555555) < 4) {
        lVar8 = -0x48;
      }
      psVar5 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_138 + 0x10);
      local_138._0_8_ = psVar5;
      if ((bool)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_d8._8_8_)->field_2)._M_local_buf[lVar8] == true) {
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)local_138,
                   *(undefined8 *)
                    ((long)&((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d8._8_8_)->_M_dataplus)->_M_current + lVar8),
                   *(undefined8 *)
                    ((long)&((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d8._8_8_)->_M_string_length)->_M_current + lVar8));
      }
      else {
        local_138._8_8_ = 0;
        local_128._0_4_ = local_128._0_4_ & 0xffffff00;
      }
      std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->content,(string *)local_138);
      if ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_138._0_8_ != psVar5) {
        operator_delete((void *)local_138._0_8_,
                        CONCAT17(local_128[7],
                                 CONCAT16(local_128[6],
                                          CONCAT15(local_128[5],
                                                   CONCAT14(local_128[4],local_128._0_4_)))) + 1);
      }
      local_128._0_4_ = 0x68747970;
      local_128[4] = 'o';
      local_128[5] = 'n';
      local_138._8_8_ = 6;
      local_128[6] = '\0';
      local_138._0_8_ = psVar5;
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json<const_char_(&)[5],_char[5],_0>
                ((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_98,(char (*) [5])"code");
      local_88.
      super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .first._M_current = (char *)0x0;
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_88.
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .second,&local_50);
      local_70 = 0;
      init._M_len = 2;
      init._M_array = (iterator)&local_98;
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json(&local_b0.owned_value,init,true,array);
      local_b0.value_ref = (value_type *)0x0;
      init_00._M_len = 1;
      init_00._M_array = &local_b0;
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_60,init_00,true,array);
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::dump((string_t *)(local_128 + 0x10),
             (basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)&local_60,-1,' ',false,strict);
      local_f0 = 0;
      local_e8._M_local_buf[0] = '\0';
      local_f8._M_p = (pointer)&local_e8;
      std::vector<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>::
      emplace_back<common_chat_tool_call>
                (&__return_storage_ptr__->tool_calls,(common_chat_tool_call *)local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_p != &local_e8) {
        operator_delete(local_f8._M_p,
                        CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0]) + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_128._17_7_,local_128[0x10]) != &local_108) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_128._17_7_,local_128[0x10]),
                        local_108._M_allocated_capacity + 1);
      }
      if ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_138._0_8_ != psVar5) {
        operator_delete((void *)local_138._0_8_,
                        CONCAT17(local_128[7],
                                 CONCAT16(local_128[6],
                                          CONCAT15(local_128[5],
                                                   CONCAT14(local_128[4],local_128._0_4_)))) + 1);
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_60,false);
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_60);
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::assert_invariant(&local_b0.owned_value,false);
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&local_b0);
      lVar8 = 0x18;
      do {
        nlohmann::json_abi_v3_11_3::
        basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)((long)&local_98 + lVar8),false);
        nlohmann::json_abi_v3_11_3::
        basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data((data *)((long)&local_98 + lVar8));
        lVar8 = lVar8 + -0x18;
      } while (lVar8 != -0x18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      if ((common_chat_parse_functionary_v3_1_llama_3_1(std::__cxx11::string_const&)::
           function_regex_abi_cxx11_ == '\0') &&
         (iVar4 = __cxa_guard_acquire(&common_chat_parse_functionary_v3_1_llama_3_1(std::__cxx11::string_const&)
                                       ::function_regex_abi_cxx11_), iVar4 != 0)) {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                   common_chat_parse_functionary_v3_1_llama_3_1(std::__cxx11::string_const&)::
                   function_regex_abi_cxx11_,"<function=(\\w+)>",0x10);
        __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                     ~basic_regex,
                     common_chat_parse_functionary_v3_1_llama_3_1(std::__cxx11::string_const&)::
                     function_regex_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&common_chat_parse_functionary_v3_1_llama_3_1(std::__cxx11::string_const&)
                             ::function_regex_abi_cxx11_);
      }
      if ((common_chat_parse_functionary_v3_1_llama_3_1(std::__cxx11::string_const&)::
           close_regex_abi_cxx11_ == '\0') &&
         (iVar4 = __cxa_guard_acquire(&common_chat_parse_functionary_v3_1_llama_3_1(std::__cxx11::string_const&)
                                       ::close_regex_abi_cxx11_), iVar4 != 0)) {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                   common_chat_parse_functionary_v3_1_llama_3_1(std::__cxx11::string_const&)::
                   close_regex_abi_cxx11_,"</function>",0x10);
        __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                     ~basic_regex,
                     common_chat_parse_functionary_v3_1_llama_3_1(std::__cxx11::string_const&)::
                     close_regex_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&common_chat_parse_functionary_v3_1_llama_3_1(std::__cxx11::string_const&)
                             ::close_regex_abi_cxx11_);
      }
      local_128[0x10] = false;
      parse_json_tool_calls
                (__return_storage_ptr__,input,
                 (optional<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_> *)
                 local_138,
                 (regex *)common_chat_parse_functionary_v3_1_llama_3_1(std::__cxx11::string_const&)
                          ::function_regex_abi_cxx11_,
                 (regex *)common_chat_parse_functionary_v3_1_llama_3_1(std::__cxx11::string_const&)
                          ::close_regex_abi_cxx11_,false);
      if (local_128[0x10] == true) {
        local_128[0x10] = false;
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_138);
      }
    }
    if ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_d8._0_8_ ==
        (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      return __return_storage_ptr__;
    }
    pcVar10 = (char *)(local_d8._16_8_ - local_d8._0_8_);
    uVar12 = local_d8._0_8_;
    goto LAB_0019919e;
  case COMMON_CHAT_FORMAT_HERMES_2_PRO:
    bVar3 = false;
    goto LAB_00198961;
  case COMMON_CHAT_FORMAT_HERMES_2_PRO_EXTRACT_REASONING:
    bVar3 = true;
LAB_00198961:
    common_chat_parse_hermes_2_pro(__return_storage_ptr__,input,bVar3);
    return __return_storage_ptr__;
  case COMMON_CHAT_FORMAT_COMMAND_R7B:
    bVar3 = false;
    goto LAB_00198938;
  case COMMON_CHAT_FORMAT_COMMAND_R7B_EXTRACT_REASONING:
    bVar3 = true;
LAB_00198938:
    common_chat_parse_command_r7b(__return_storage_ptr__,input,bVar3);
    return __return_storage_ptr__;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    common_chat_format_name_abi_cxx11_((string *)&local_98,format);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                   "Unsupported format: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98);
    std::runtime_error::runtime_error(this_00,(string *)local_138);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_138._0_8_ !=
      (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)(local_138 + 0x10)) {
    _Var11._M_current =
         (char *)CONCAT17(local_128[7],
                          CONCAT16(local_128[6],
                                   CONCAT15(local_128[5],CONCAT14(local_128[4],local_128._0_4_))));
    uVar12 = local_138._0_8_;
LAB_0019919b:
    pcVar10 = _Var11._M_current + 1;
LAB_0019919e:
    operator_delete((void *)uVar12,(ulong)pcVar10);
  }
  return __return_storage_ptr__;
}

Assistant:

common_chat_msg common_chat_parse(const std::string & input, common_chat_format format) {
    switch (format) {
        case COMMON_CHAT_FORMAT_CONTENT_ONLY:
            return common_chat_parse_content_only(input);
        case COMMON_CHAT_FORMAT_GENERIC:
            return common_chat_parse_generic(input);
        case COMMON_CHAT_FORMAT_MISTRAL_NEMO:
            return common_chat_parse_mistral_nemo(input);
        case COMMON_CHAT_FORMAT_LLAMA_3_X:
            return common_chat_parse_llama_3_1(input);
        case COMMON_CHAT_FORMAT_LLAMA_3_X_WITH_BUILTIN_TOOLS:
            return common_chat_parse_llama_3_1(input, /* with_builtin_tools= */ true);
        case COMMON_CHAT_FORMAT_DEEPSEEK_R1:
            return common_chat_parse_deepseek_r1(input, /* extract_reasoning= */ false);
        case COMMON_CHAT_FORMAT_DEEPSEEK_R1_EXTRACT_REASONING:
            return common_chat_parse_deepseek_r1(input, /* extract_reasoning= */ true);
        case COMMON_CHAT_FORMAT_FUNCTIONARY_V3_2:
            return common_chat_parse_functionary_v3_2(input);
        case COMMON_CHAT_FORMAT_FUNCTIONARY_V3_1_LLAMA_3_1:
            return common_chat_parse_functionary_v3_1_llama_3_1(input);
        case COMMON_CHAT_FORMAT_HERMES_2_PRO:
            return common_chat_parse_hermes_2_pro(input, /* extract_reasoning= */ false);
        case COMMON_CHAT_FORMAT_HERMES_2_PRO_EXTRACT_REASONING:
            return common_chat_parse_hermes_2_pro(input, /* extract_reasoning= */ true);
        case COMMON_CHAT_FORMAT_FIREFUNCTION_V2:
            return common_chat_parse_firefunction_v2(input);
        case COMMON_CHAT_FORMAT_COMMAND_R7B:
            return common_chat_parse_command_r7b(input, /* extract_reasoning= */ false);
        case COMMON_CHAT_FORMAT_COMMAND_R7B_EXTRACT_REASONING:
            return common_chat_parse_command_r7b(input, /* extract_reasoning= */ true);
        default:
            throw std::runtime_error("Unsupported format: " + common_chat_format_name(format));
    }
}